

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O2

void __thiscall Sinclair::ZXSpectrum::State::State(State *this)

{
  allocator<char> local_49;
  string local_48;
  
  (this->super_StructImpl<Sinclair::ZXSpectrum::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058f170;
  CPU::Z80::State::State(&this->z80);
  ZXSpectrum::Video::State::State(&this->video);
  *(undefined8 *)
   ((long)&(this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GI::AY38910::State::State(&this->ay);
  this->last_1ffd = '\0';
  if (Reflection::StructImpl<Sinclair::ZXSpectrum::State>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"z80",&local_49);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<CPU::Z80::State>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->z80,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"video",&local_49);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<Sinclair::ZXSpectrum::Video::State>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->video,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ram",&local_49);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::
    declare<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->ram,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"last_7ffd",&local_49);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->last_7ffd,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"last_1ffd",&local_49);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->last_1ffd,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ay",&local_49);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<GI::AY38910::State>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->ay,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(z80);
			DeclareField(video);
			DeclareField(ram);
			DeclareField(last_7ffd);
			DeclareField(last_1ffd);
			DeclareField(ay);
		}
	}